

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall
DomConnectionHint::read(DomConnectionHint *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  DomConnectionHint *size;
  long in_FS_OFFSET;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  DomConnectionHint *in_stack_fffffffffffffe00;
  undefined2 in_stack_fffffffffffffe08;
  byte in_stack_fffffffffffffe0a;
  byte in_stack_fffffffffffffe0b;
  undefined4 in_stack_fffffffffffffe0c;
  DomConnectionHint *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  byte in_stack_fffffffffffffe1f;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined1 local_168 [64];
  undefined1 local_128 [64];
  undefined1 local_e8 [16];
  QLatin1StringView local_d8;
  QStringView local_98;
  QStringView local_48;
  QXmlStreamAttribute *local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  size = (DomConnectionHint *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe00);
  local_30.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe00);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,local_30);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48.m_size = 0xaaaaaaaaaaaaaaaa;
    local_48 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1c53c0);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
               (size_t)in_stack_fffffffffffffe10);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffe10,
               (QString *)
               CONCAT44(in_stack_fffffffffffffe0c,
                        CONCAT13(in_stack_fffffffffffffe0b,
                                 CONCAT12(in_stack_fffffffffffffe0a,in_stack_fffffffffffffe08))));
    in_stack_fffffffffffffe1f =
         ::operator==((QStringView *)in_stack_fffffffffffffe00,
                      (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0x1c5424);
    if ((in_stack_fffffffffffffe1f & 1) == 0) {
      in_stack_fffffffffffffe10 = size;
      local_d8 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffffe0c,
                                             CONCAT13(in_stack_fffffffffffffe0b,
                                                      CONCAT12(in_stack_fffffffffffffe0a,
                                                               in_stack_fffffffffffffe08))),
                            (size_t)in_stack_fffffffffffffe00);
      ::operator+((QLatin1String *)in_stack_fffffffffffffe00,
                  (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QXmlStreamReader::raiseError(&in_stack_fffffffffffffe10->m_attr_type);
      QString::~QString((QString *)0x1c54fa);
    }
    else {
      local_98 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1c5438);
      QStringView::toString((QStringView *)in_stack_fffffffffffffe00);
      setAttributeType(in_stack_fffffffffffffe00,
                       (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QString::~QString((QString *)0x1c547c);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1c5518);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001c577c;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_e8._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_e8._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_e8 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 (size_t)in_stack_fffffffffffffe10);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffe10,
                 (QString *)
                 CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe0b,
                                         CONCAT12(in_stack_fffffffffffffe0a,
                                                  in_stack_fffffffffffffe08))));
      other.m_data._0_4_ = in_stack_fffffffffffffe28;
      other.m_size = (qsizetype)this;
      other.m_data._4_4_ = in_stack_fffffffffffffe2c;
      iVar3 = QStringView::compare
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),other,
                         CaseInsensitive);
      in_stack_fffffffffffffe0b = iVar3 != 0 ^ 0xff;
      QString::~QString((QString *)0x1c55ea);
      if ((in_stack_fffffffffffffe0b & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                   (size_t)in_stack_fffffffffffffe10);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffe10,
                   (QString *)
                   CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe0b,
                                           CONCAT12(in_stack_fffffffffffffe0a,
                                                    in_stack_fffffffffffffe08))));
        other_00.m_data._0_4_ = in_stack_fffffffffffffe28;
        other_00.m_size = (qsizetype)this;
        other_00.m_data._4_4_ = in_stack_fffffffffffffe2c;
        iVar3 = QStringView::compare
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),other_00,
                           CaseInsensitive);
        in_stack_fffffffffffffe0a = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1c56a2);
        if ((in_stack_fffffffffffffe0a & 1) == 0) {
          in_stack_fffffffffffffe00 = size;
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe0b,
                                                     CONCAT12(in_stack_fffffffffffffe0a,
                                                              in_stack_fffffffffffffe08))),
                     (size_t)size);
          ::operator+((QLatin1String *)in_stack_fffffffffffffe00,
                      (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          QXmlStreamReader::raiseError(&in_stack_fffffffffffffe00->m_attr_type);
          QString::~QString((QString *)0x1c5761);
        }
        else {
          QXmlStreamReader::readElementText(local_168,size,0);
          iVar2 = QString::toInt((QString *)
                                 CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe0b,
                                                         CONCAT12(in_stack_fffffffffffffe0a,
                                                                  in_stack_fffffffffffffe08))),
                                 (bool *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
          setElementY(this,iVar2);
          QString::~QString((QString *)0x1c56ef);
        }
      }
      else {
        QXmlStreamReader::readElementText(local_128,size,0);
        iVar2 = QString::toInt((QString *)
                               CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe0b,
                                                       CONCAT12(in_stack_fffffffffffffe0a,
                                                                in_stack_fffffffffffffe08))),
                               (bool *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
        setElementX(this,iVar2);
        QString::~QString((QString *)0x1c5637);
      }
    }
  } while (iVar2 != 5);
LAB_001c577c:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1c5789);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnectionHint::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"type"_s) {
            setAttributeType(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"x"_s, Qt::CaseInsensitive)) {
                setElementX(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"y"_s, Qt::CaseInsensitive)) {
                setElementY(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}